

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderOperatorTests.cpp
# Opt level: O0

void __thiscall
vkt::sr::anon_unknown_0::OperatorShaderEvaluator::evaluate
          (OperatorShaderEvaluator *this,ShaderEvalContext *ctx)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool *pbVar4;
  float *pfVar5;
  int local_1c;
  int channelNdx;
  ShaderEvalContext *ctx_local;
  OperatorShaderEvaluator *this_local;
  
  (*this->m_evalFunc)(ctx);
  for (local_1c = 0; local_1c < 4; local_1c = local_1c + 1) {
    pbVar4 = tcu::Vector<bool,_4>::operator[]
                       ((Vector<bool,_4> *)
                        (sr::(anonymous_namespace)::s_outSwizzleChannelMasks +
                        (long)(this->m_resultScalarSize + -1) * 4),local_1c);
    if ((*pbVar4 & 1U) != 0) {
      pfVar5 = tcu::Vector<float,_4>::operator[](&ctx->color,local_1c);
      fVar1 = *pfVar5;
      fVar2 = this->m_evaluatedScale;
      fVar3 = this->m_evaluatedBias;
      pfVar5 = tcu::Vector<float,_4>::operator[](&ctx->color,local_1c);
      *pfVar5 = fVar1 * fVar2 + fVar3;
    }
  }
  return;
}

Assistant:

virtual void evaluate (ShaderEvalContext& ctx) const
	{
		m_evalFunc(ctx);

		for (int channelNdx = 0; channelNdx < 4; channelNdx++)
			if (s_outSwizzleChannelMasks[m_resultScalarSize - 1][channelNdx])
				ctx.color[channelNdx] = ctx.color[channelNdx] * m_evaluatedScale + m_evaluatedBias;
	}